

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_false>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  NodeRef *pNVar2;
  uint uVar3;
  size_t sVar4;
  _func_int **pp_Var5;
  size_t i_1;
  int iVar6;
  ulong uVar7;
  long lVar8;
  undefined4 uVar9;
  size_t sVar10;
  size_t sVar11;
  NodeRef *pNVar12;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar13;
  size_t sVar14;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  vint4 ai_2;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar26;
  vint4 ai;
  undefined1 auVar27 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar28;
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vint4 ai_3;
  undefined1 auVar31 [16];
  vint4 bi;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 bi_1;
  undefined1 auVar35 [16];
  vint4 bi_3;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_2;
  undefined1 auVar38 [64];
  float fVar39;
  float fVar42;
  float fVar43;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar54;
  float fVar55;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar56;
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  vint4 bi_8;
  undefined1 local_17c8 [16];
  RTCIntersectFunctionNArguments local_17b0;
  Geometry *local_1780;
  undefined8 local_1778;
  RTCIntersectArguments *local_1770;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar41 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar20 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar41);
    iVar6 = vmovmskps_avx(auVar20);
    uVar7 = CONCAT44((int)((ulong)This >> 0x20),iVar6);
    if (iVar6 != 0) {
      auVar21 = *(undefined1 (*) [16])(ray + 0x40);
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar19 = vandps_avx(auVar21,auVar18);
      auVar32._8_4_ = 0x219392ef;
      auVar32._0_8_ = 0x219392ef219392ef;
      auVar32._12_4_ = 0x219392ef;
      auVar19 = vcmpps_avx(auVar19,auVar32,1);
      auVar22 = vblendvps_avx(auVar21,auVar32,auVar19);
      auVar19 = *(undefined1 (*) [16])(ray + 0x50);
      auVar36 = vandps_avx(auVar19,auVar18);
      auVar36 = vcmpps_avx(auVar36,auVar32,1);
      auVar23 = vblendvps_avx(auVar19,auVar32,auVar36);
      auVar36 = *(undefined1 (*) [16])(ray + 0x60);
      auVar18 = vandps_avx(auVar36,auVar18);
      auVar18 = vcmpps_avx(auVar18,auVar32,1);
      auVar18 = vblendvps_avx(auVar36,auVar32,auVar18);
      auVar32 = vrcpps_avx(auVar22);
      fVar39 = auVar32._0_4_;
      auVar29._0_4_ = auVar22._0_4_ * fVar39;
      fVar42 = auVar32._4_4_;
      auVar29._4_4_ = auVar22._4_4_ * fVar42;
      fVar43 = auVar32._8_4_;
      auVar29._8_4_ = auVar22._8_4_ * fVar43;
      fVar44 = auVar32._12_4_;
      auVar29._12_4_ = auVar22._12_4_ * fVar44;
      auVar45._8_4_ = 0x3f800000;
      auVar45._0_8_ = 0x3f8000003f800000;
      auVar45._12_4_ = 0x3f800000;
      auVar32 = vsubps_avx(auVar45,auVar29);
      auVar22 = vrcpps_avx(auVar23);
      fVar47 = auVar22._0_4_;
      auVar33._0_4_ = auVar23._0_4_ * fVar47;
      fVar48 = auVar22._4_4_;
      auVar33._4_4_ = auVar23._4_4_ * fVar48;
      fVar49 = auVar22._8_4_;
      auVar33._8_4_ = auVar23._8_4_ * fVar49;
      fVar50 = auVar22._12_4_;
      auVar33._12_4_ = auVar23._12_4_ * fVar50;
      auVar23 = vsubps_avx(auVar45,auVar33);
      auVar22 = vrcpps_avx(auVar18);
      fVar51 = auVar22._0_4_;
      auVar40._0_4_ = auVar18._0_4_ * fVar51;
      fVar54 = auVar22._4_4_;
      auVar40._4_4_ = auVar18._4_4_ * fVar54;
      fVar55 = auVar22._8_4_;
      auVar40._8_4_ = auVar18._8_4_ * fVar55;
      fVar56 = auVar22._12_4_;
      auVar40._12_4_ = auVar18._12_4_ * fVar56;
      auVar18 = vsubps_avx(auVar45,auVar40);
      auVar22 = ZEXT816(0);
      auVar21 = vcmpps_avx(auVar21,auVar22,1);
      auVar52._8_4_ = 1;
      auVar52._0_8_ = 0x100000001;
      auVar52._12_4_ = 1;
      auVar21 = vandps_avx(auVar52,auVar21);
      auVar19 = vcmpps_avx(auVar19,auVar22,1);
      auVar53._8_4_ = 2;
      auVar53._0_8_ = 0x200000002;
      auVar53._12_4_ = 2;
      auVar19 = vandps_avx(auVar53,auVar19);
      auVar19 = vorps_avx(auVar19,auVar21);
      auVar57 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar21 = vcmpps_avx(auVar36,auVar22,1);
      auVar36._8_4_ = 4;
      auVar36._0_8_ = 0x400000004;
      auVar36._12_4_ = 4;
      auVar21 = vandps_avx(auVar21,auVar36);
      auVar46 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar58 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      auVar41 = vpor_avx(auVar20 ^ auVar41,auVar21);
      local_17c8 = vpor_avx(auVar19,auVar41);
      do {
        lVar8 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar9 = *(undefined4 *)(local_17c8 + lVar8 * 4);
        auVar41._4_4_ = uVar9;
        auVar41._0_4_ = uVar9;
        auVar41._8_4_ = uVar9;
        auVar41._12_4_ = uVar9;
        auVar41 = vpcmpeqd_avx(auVar41,local_17c8);
        uVar9 = vmovmskps_avx(auVar41);
        uVar7 = uVar7 & ~CONCAT44((int)((ulong)lVar8 >> 0x20),uVar9);
      } while (uVar7 != 0);
      local_17c8 = vpcmpeqd_avx(local_17c8,local_17c8);
      auVar21 = vpcmpeqd_avx(local_17c8,(undefined1  [16])valid_i->field_0);
      fVar39 = fVar39 + auVar32._0_4_ * fVar39;
      fVar42 = fVar42 + auVar32._4_4_ * fVar42;
      fVar43 = fVar43 + auVar32._8_4_ * fVar43;
      fVar44 = fVar44 + auVar32._12_4_ * fVar44;
      fVar47 = fVar47 + auVar23._0_4_ * fVar47;
      fVar48 = fVar48 + auVar23._4_4_ * fVar48;
      fVar49 = fVar49 + auVar23._8_4_ * fVar49;
      fVar50 = fVar50 + auVar23._12_4_ * fVar50;
      fVar51 = auVar18._0_4_ * fVar51 + fVar51;
      fVar54 = auVar18._4_4_ * fVar54 + fVar54;
      fVar55 = auVar18._8_4_ * fVar55 + fVar55;
      fVar56 = auVar18._12_4_ * fVar56 + fVar56;
      auVar41 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      auVar20 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_16f8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar41,auVar21);
      auVar19._8_4_ = 0xff800000;
      auVar19._0_8_ = 0xff800000ff800000;
      auVar19._12_4_ = 0xff800000;
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     vblendvps_avx(auVar19,auVar20,auVar21);
      pNVar12 = stack_node + 2;
      paVar13 = &stack_near[2].field_0;
      auVar38 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = local_16f8;
      local_1718 = *(undefined1 (*) [16])ray;
      local_1728 = *(undefined1 (*) [16])(ray + 0x10);
      local_1738 = *(undefined1 (*) [16])(ray + 0x20);
      local_1748 = fVar39;
      fStack_1744 = fVar42;
      fStack_1740 = fVar43;
      fStack_173c = fVar44;
      local_1758 = fVar47;
      fStack_1754 = fVar48;
      fStack_1750 = fVar49;
      fStack_174c = fVar50;
      local_1768 = fVar51;
      fStack_1764 = fVar54;
      fStack_1760 = fVar55;
      fStack_175c = fVar56;
LAB_00ece8b9:
      pNVar2 = pNVar12 + -1;
      if (pNVar2->ptr != 0xfffffffffffffff8) {
        pNVar12 = pNVar12 + -1;
        paVar1 = paVar13 + -1;
        auVar17 = ZEXT1664((undefined1  [16])*paVar1);
        paVar13 = paVar13 + -1;
        auVar41 = vcmpps_avx((undefined1  [16])*paVar1,(undefined1  [16])bi_8.field_0,1);
        sVar14 = pNVar2->ptr;
        if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar41[0xf] < '\0') {
          while ((sVar14 & 8) == 0) {
            auVar17 = ZEXT1664(auVar38._0_16_);
            uVar7 = 0;
            sVar4 = 8;
            for (lVar8 = 0;
                (lVar8 != 4 &&
                (sVar11 = *(size_t *)((sVar14 & 0xfffffffffffffff0) + lVar8 * 8), sVar11 != 8));
                lVar8 = lVar8 + 1) {
              uVar9 = *(undefined4 *)(sVar14 + 0x20 + lVar8 * 4);
              auVar20._4_4_ = uVar9;
              auVar20._0_4_ = uVar9;
              auVar20._8_4_ = uVar9;
              auVar20._12_4_ = uVar9;
              auVar41 = vsubps_avx(auVar20,auVar57._0_16_);
              auVar27._0_4_ = fVar39 * auVar41._0_4_;
              auVar27._4_4_ = fVar42 * auVar41._4_4_;
              auVar27._8_4_ = fVar43 * auVar41._8_4_;
              auVar27._12_4_ = fVar44 * auVar41._12_4_;
              uVar9 = *(undefined4 *)(sVar14 + 0x40 + lVar8 * 4);
              auVar21._4_4_ = uVar9;
              auVar21._0_4_ = uVar9;
              auVar21._8_4_ = uVar9;
              auVar21._12_4_ = uVar9;
              auVar41 = vsubps_avx(auVar21,auVar46._0_16_);
              auVar30._0_4_ = fVar47 * auVar41._0_4_;
              auVar30._4_4_ = fVar48 * auVar41._4_4_;
              auVar30._8_4_ = fVar49 * auVar41._8_4_;
              auVar30._12_4_ = fVar50 * auVar41._12_4_;
              uVar9 = *(undefined4 *)(sVar14 + 0x60 + lVar8 * 4);
              auVar22._4_4_ = uVar9;
              auVar22._0_4_ = uVar9;
              auVar22._8_4_ = uVar9;
              auVar22._12_4_ = uVar9;
              auVar41 = vsubps_avx(auVar22,auVar58._0_16_);
              auVar31._0_4_ = fVar51 * auVar41._0_4_;
              auVar31._4_4_ = fVar54 * auVar41._4_4_;
              auVar31._8_4_ = fVar55 * auVar41._8_4_;
              auVar31._12_4_ = fVar56 * auVar41._12_4_;
              uVar9 = *(undefined4 *)(sVar14 + 0x30 + lVar8 * 4);
              auVar23._4_4_ = uVar9;
              auVar23._0_4_ = uVar9;
              auVar23._8_4_ = uVar9;
              auVar23._12_4_ = uVar9;
              auVar41 = vsubps_avx(auVar23,auVar57._0_16_);
              auVar34._0_4_ = fVar39 * auVar41._0_4_;
              auVar34._4_4_ = fVar42 * auVar41._4_4_;
              auVar34._8_4_ = fVar43 * auVar41._8_4_;
              auVar34._12_4_ = fVar44 * auVar41._12_4_;
              uVar9 = *(undefined4 *)(sVar14 + 0x50 + lVar8 * 4);
              auVar24._4_4_ = uVar9;
              auVar24._0_4_ = uVar9;
              auVar24._8_4_ = uVar9;
              auVar24._12_4_ = uVar9;
              auVar41 = vsubps_avx(auVar24,auVar46._0_16_);
              auVar35._0_4_ = fVar47 * auVar41._0_4_;
              auVar35._4_4_ = fVar48 * auVar41._4_4_;
              auVar35._8_4_ = fVar49 * auVar41._8_4_;
              auVar35._12_4_ = fVar50 * auVar41._12_4_;
              uVar9 = *(undefined4 *)(sVar14 + 0x70 + lVar8 * 4);
              auVar25._4_4_ = uVar9;
              auVar25._0_4_ = uVar9;
              auVar25._8_4_ = uVar9;
              auVar25._12_4_ = uVar9;
              auVar41 = vsubps_avx(auVar25,auVar58._0_16_);
              auVar37._0_4_ = fVar51 * auVar41._0_4_;
              auVar37._4_4_ = fVar54 * auVar41._4_4_;
              auVar37._8_4_ = fVar55 * auVar41._8_4_;
              auVar37._12_4_ = fVar56 * auVar41._12_4_;
              auVar41 = vpminsd_avx(auVar27,auVar34);
              auVar20 = vpminsd_avx(auVar30,auVar35);
              auVar41 = vpmaxsd_avx(auVar41,auVar20);
              auVar20 = vpminsd_avx(auVar31,auVar37);
              auVar20 = vpmaxsd_avx(auVar41,auVar20);
              auVar41 = vpmaxsd_avx(auVar27,auVar34);
              auVar21 = vpmaxsd_avx(auVar30,auVar35);
              auVar19 = vpminsd_avx(auVar41,auVar21);
              auVar41 = vpmaxsd_avx(auVar31,auVar37);
              auVar21 = vpmaxsd_avx(auVar20,(undefined1  [16])local_16f8);
              auVar41 = vpminsd_avx(auVar41,(undefined1  [16])bi_8.field_0);
              auVar41 = vpminsd_avx(auVar19,auVar41);
              auVar41 = vcmpps_avx(auVar21,auVar41,2);
              if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar41[0xf] < '\0') {
                aVar28 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx(auVar38._0_16_,auVar20,auVar41);
                aVar15 = auVar17._0_16_;
                auVar41 = vcmpps_avx((undefined1  [16])aVar28,(undefined1  [16])aVar15,1);
                sVar10 = sVar4;
                aVar26 = aVar28;
                if (((((auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     -1 < auVar41[0xf]) ||
                   (sVar10 = sVar11, sVar11 = sVar4, aVar26 = aVar15, aVar15 = aVar28, sVar4 != 8))
                {
                  aVar28 = aVar15;
                  uVar7 = uVar7 + 1;
                  pNVar12->ptr = sVar11;
                  pNVar12 = pNVar12 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar13->v = aVar26;
                  paVar13 = paVar13 + 1;
                }
                sVar4 = sVar10;
                auVar17 = ZEXT1664((undefined1  [16])aVar28);
              }
            }
            if (sVar4 == 8) goto LAB_00ece8b9;
            sVar14 = sVar4;
            if (1 < uVar7) {
              aVar28 = paVar13[-2];
              aVar26 = paVar13[-1];
              auVar41 = vcmpps_avx((undefined1  [16])aVar28,(undefined1  [16])aVar26,1);
              aVar15 = aVar26;
              if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar41[0xf] < '\0') {
                paVar13[-2] = aVar26;
                paVar13[-1] = aVar28;
                auVar41 = vpermilps_avx(*(undefined1 (*) [16])(pNVar12 + -2),0x4e);
                *(undefined1 (*) [16])(pNVar12 + -2) = auVar41;
                aVar15 = aVar28;
                aVar28 = aVar26;
              }
              if (uVar7 != 2) {
                aVar26 = paVar13[-3];
                auVar41 = vcmpps_avx((undefined1  [16])aVar26,(undefined1  [16])aVar15,1);
                if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar41[0xf] < '\0') {
                  paVar13[-3] = aVar15;
                  paVar13[-1] = aVar26;
                  sVar4 = pNVar12[-3].ptr;
                  pNVar12[-3].ptr = pNVar12[-1].ptr;
                  pNVar12[-1].ptr = sVar4;
                  aVar26 = aVar15;
                }
                auVar41 = vcmpps_avx((undefined1  [16])aVar26,(undefined1  [16])aVar28,1);
                if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar41[0xf] < '\0') {
                  paVar13[-3] = aVar28;
                  paVar13[-2] = aVar26;
                  auVar41 = vpermilps_avx(*(undefined1 (*) [16])(pNVar12 + -3),0x4e);
                  *(undefined1 (*) [16])(pNVar12 + -3) = auVar41;
                }
              }
            }
          }
          if (sVar14 == 0xfffffffffffffff8) {
            return;
          }
          local_1708 = vcmpps_avx((undefined1  [16])bi_8.field_0,auVar17._0_16_,6);
          auVar17 = ZEXT1664(local_1708);
          if ((((local_1708 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (local_1708 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_1708 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              local_1708[0xf] < '\0') {
            for (lVar8 = 0; auVar41 = auVar17._0_16_, (ulong)((uint)sVar14 & 0xf) - 8 != lVar8;
                lVar8 = lVar8 + 1) {
              local_17b0.geomID = *(uint *)((sVar14 & 0xfffffffffffffff0) + lVar8 * 8);
              local_1780 = (context->scene->geometries).items[local_17b0.geomID].ptr;
              uVar3 = local_1780->mask;
              auVar16._4_4_ = uVar3;
              auVar16._0_4_ = uVar3;
              auVar16._8_4_ = uVar3;
              auVar16._12_4_ = uVar3;
              auVar20 = vandps_avx(auVar16,*(undefined1 (*) [16])(ray + 0x90));
              auVar20 = vpcmpeqd_avx(auVar20,_DAT_01f45a50);
              auVar21 = auVar41 & ~auVar20;
              if ((((auVar21 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar21 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar21 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar21[0xf] < '\0') {
                mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                               vandnps_avx(auVar20,auVar41);
                local_17b0.primID = *(uint *)((sVar14 & 0xfffffffffffffff0) + 4 + lVar8 * 8);
                local_17b0.valid = (int *)&mask;
                local_17b0.geometryUserPtr = local_1780->userPtr;
                local_17b0.context = context->user;
                local_17b0.N = 4;
                local_1778 = 0;
                local_1770 = context->args;
                pp_Var5 = (_func_int **)local_1770->intersect;
                if (pp_Var5 == (_func_int **)0x0) {
                  pp_Var5 = local_1780[1].super_RefCount._vptr_RefCount;
                }
                local_17b0.rayhit = (RTCRayHitN *)ray;
                (*(code *)pp_Var5)(&local_17b0);
                auVar57 = ZEXT1664(local_1718);
                auVar46 = ZEXT1664(local_1728);
                auVar58 = ZEXT1664(local_1738);
                auVar38 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar17 = ZEXT1664(local_1708);
                fVar39 = local_1748;
                fVar42 = fStack_1744;
                fVar43 = fStack_1740;
                fVar44 = fStack_173c;
                fVar47 = local_1758;
                fVar48 = fStack_1754;
                fVar49 = fStack_1750;
                fVar50 = fStack_174c;
                fVar51 = local_1768;
                fVar54 = fStack_1764;
                fVar55 = fStack_1760;
                fVar56 = fStack_175c;
              }
            }
            bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                           vblendvps_avx((undefined1  [16])bi_8.field_0,
                                         *(undefined1 (*) [16])(ray + 0x80),auVar41);
          }
        }
        goto LAB_00ece8b9;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }